

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

unique_ptr<cmInstallFileSetGenerator,_std::default_delete<cmInstallFileSetGenerator>_> __thiscall
anon_unknown.dwarf_5e0633::CreateInstallFileSetGenerator
          (anon_unknown_dwarf_5e0633 *this,Helper *helper,cmTarget *target,cmFileSet *fileSet,
          string *destination,cmInstallCommandArguments *args)

{
  cmInstallCommandArguments *__args_3;
  string *__args_1;
  string *__args_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_5;
  string *__args_6;
  undefined1 local_50 [19];
  bool local_3d;
  MessageLevel local_3c;
  cmInstallCommandArguments *pcStack_38;
  MessageLevel message;
  cmInstallCommandArguments *args_local;
  string *destination_local;
  cmFileSet *fileSet_local;
  cmTarget *target_local;
  Helper *helper_local;
  
  pcStack_38 = args;
  args_local = (cmInstallCommandArguments *)destination;
  destination_local = &fileSet->Name;
  fileSet_local = (cmFileSet *)target;
  target_local = (cmTarget *)helper;
  helper_local = (Helper *)this;
  local_3c = cmInstallGenerator::SelectMessageLevel(helper->Makefile,false);
  __args_1 = cmTarget::GetName_abi_cxx11_((cmTarget *)fileSet_local);
  __args_3 = args_local;
  __args_4 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(pcStack_38);
  __args_5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmInstallCommandArguments::GetConfigurations_abi_cxx11_(pcStack_38);
  __args_6 = cmInstallCommandArguments::GetComponent_abi_cxx11_(pcStack_38);
  local_3d = cmInstallCommandArguments::GetExcludeFromAll(pcStack_38);
  local_50[0x12] = cmInstallCommandArguments::GetOptional(pcStack_38);
  cmMakefile::GetBacktrace((cmMakefile *)local_50);
  std::
  make_unique<cmInstallFileSetGenerator,std::__cxx11::string_const&,cmFileSet*&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,bool,cmListFileBacktrace>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (cmFileSet **)__args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&destination_local
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_3,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__args_4,__args_5,(MessageLevel *)__args_6,(bool *)&local_3c,&local_3d,
             (cmListFileBacktrace *)(local_50 + 0x12));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_50);
  return (__uniq_ptr_data<cmInstallFileSetGenerator,_std::default_delete<cmInstallFileSetGenerator>,_true,_true>
          )(__uniq_ptr_data<cmInstallFileSetGenerator,_std::default_delete<cmInstallFileSetGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmInstallFileSetGenerator> CreateInstallFileSetGenerator(
  Helper& helper, cmTarget& target, cmFileSet* fileSet,
  const std::string& destination, const cmInstallCommandArguments& args)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile);
  return cm::make_unique<cmInstallFileSetGenerator>(
    target.GetName(), fileSet, destination, args.GetPermissions(),
    args.GetConfigurations(), args.GetComponent(), message,
    args.GetExcludeFromAll(), args.GetOptional(),
    helper.Makefile->GetBacktrace());
}